

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::checkActiveSubroutineUniformiv
          (FunctionalTest3_4 *this,GLuint program_id,GLuint index,GLenum pname,GLint expected)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  GLchar *local_1d0 [3];
  MessageBuilder local_1b8;
  int local_34;
  long lStack_30;
  GLint value;
  Functions *gl;
  GLint expected_local;
  GLenum pname_local;
  GLuint index_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  gl._0_4_ = expected;
  gl._4_4_ = pname;
  expected_local = index;
  pname_local = program_id;
  _index_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = 0;
  (**(code **)(lStack_30 + 0x748))(pname_local,0x8b31,expected_local,gl._4_4_,&local_34);
  err = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(err,"getActiveSubroutineUniformiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xc59);
  bVar4 = (GLint)gl == local_34;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [64])
                        "Error. Invalid result. Function: getActiveSubroutineUniformiv. ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2a0b2f8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&expected_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b094bb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2a5ae01);
    local_1d0[0] = Utils::pnameToStr(gl._4_4_);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b094bb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])0x2a0bcc6);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_34);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b094bb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x2af3820);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar4;
}

Assistant:

bool FunctionalTest3_4::checkActiveSubroutineUniformiv(GLuint program_id, GLuint index, GLenum pname,
													   GLint expected) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLint				  value = 0;

	gl.getActiveSubroutineUniformiv(program_id, GL_VERTEX_SHADER, index, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getActiveSubroutineUniformiv");

	if (expected != value)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. Function: getActiveSubroutineUniformiv. "
											<< "idnex: " << index << ". "
											<< "pname: " << Utils::pnameToStr(pname) << ". "
											<< "Result: " << value << ". "
											<< "Expected: " << expected << "." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}